

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O2

bool JsUtil::NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode_*>::Equals
               (CaseInvariantPropertyListWithHashCode *list1,CharacterBuffer<char16_t> *str)

{
  uint uVar1;
  Type pcVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RecyclerWeakReference<const_Js::PropertyRecord> *pRVar6;
  undefined1 local_38 [8];
  CharacterBuffer<char16_t> string;
  
  if (list1 == (CaseInvariantPropertyListWithHashCode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                       ,0xb5,"(list1 != nullptr)","list1 != nullptr");
    if (!bVar4) goto LAB_006e7809;
    *puVar5 = 0;
  }
  pRVar6 = List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::CompactEnd<true>(&list1->
                               super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                             );
  if (pRVar6 == (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0) {
    bVar4 = false;
  }
  else {
    pcVar2 = (pRVar6->super_RecyclerWeakReferenceBase).strongRef;
    if (pcVar2 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                         ,0xbf,"(prop)","prop");
      if (!bVar4) {
LAB_006e7809:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    uVar1 = *(uint *)(pcVar2 + 0x14);
    Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet
              ((WriteBarrierPtr<const_char16_t> *)local_38,(char16_t *)(pcVar2 + 0x18));
    string.string.ptr._0_4_ = uVar1 >> 1;
    bVar4 = NoCaseComparer<JsUtil::CharacterBuffer<char16_t>_>::Equals
                      ((CharacterBuffer<char16_t> *)local_38,str);
  }
  return bVar4;
}

Assistant:

bool NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode*>::Equals(_In_ Js::CaseInvariantPropertyListWithHashCode* list1, JsUtil::CharacterBuffer<WCHAR> const& str)
    {
        Assert(list1 != nullptr);

        const RecyclerWeakReference<Js::PropertyRecord const>* propRecordWeakRef = list1->CompactEnd<true>();

        // If the lists are empty post-compaction, thats fine, we'll just remove them later
        if (propRecordWeakRef != nullptr)
        {
            const Js::PropertyRecord* prop = propRecordWeakRef->Get();

            // Since compaction returned this pointer, their strong refs should not be null
            Assert(prop);

            JsUtil::CharacterBuffer<WCHAR> string(prop->GetBuffer(), prop->GetLength());

            return NoCaseComparer<JsUtil::CharacterBuffer<WCHAR> >::Equals(string, str);
        }

        // If either of the property strings contains no entries, the two lists are not equivalent
        return false;
    }